

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

timestamp_t __thiscall
duckdb::TimeBucket::OriginTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (OriginTernaryOperator *this,interval_t bucket_width,timestamp_t ts,timestamp_t origin,
          ValidityMask *mask,idx_t idx)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar2;
  interval_t bucket_width_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  BucketWidthType BVar6;
  timestamp_t tVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  NotImplementedException *this_01;
  int64_t unaff_RBX;
  string local_58;
  unsigned_long in_stack_ffffffffffffffc8;
  
  tVar7.value = origin.value;
  bVar5 = Value::IsFinite<duckdb::timestamp_t>(ts);
  if (!bVar5) {
    if (*(long *)origin.value == 0) {
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long *)&stack0xffffffffffffffc8);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(origin.value + 0x10);
      *(pointer *)(origin.value + 8) = _Var3._M_p;
      *(size_type *)(origin.value + 0x10) = sVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (origin.value + 8));
      *(unsigned_long **)origin.value =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar2 = (byte)mask & 0x3f;
    puVar1 = (ulong *)(*(long *)origin.value + ((ulong)mask >> 6) * 8);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    return (timestamp_t)0;
  }
  bucket_width_00.micros = unaff_RBX;
  bucket_width_00.months = (int)in_stack_ffffffffffffffc8;
  bucket_width_00.days = (int)(in_stack_ffffffffffffffc8 >> 0x20);
  BVar6 = ClassifyBucketWidthErrorThrow(bucket_width_00);
  if (BVar6 != CONVERTIBLE_TO_MONTHS) {
    if (BVar6 == CONVERTIBLE_TO_MICROS) {
      tVar7 = OriginWidthConvertibleToMicrosTernaryOperator::
              Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                        ((OriginWidthConvertibleToMicrosTernaryOperator *)this,bucket_width,ts,tVar7
                        );
      return (timestamp_t)tVar7.value;
    }
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Bucket type not implemented for TIME_BUCKET","");
    NotImplementedException::NotImplementedException(this_01,&local_58);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  tVar7 = OriginWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                    ((OriginWidthConvertibleToMonthsTernaryOperator *)this,bucket_width,ts,tVar7);
  return (timestamp_t)tVar7.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin, ValidityMask &mask, idx_t idx) {
			if (!Value::IsFinite(origin)) {
				mask.SetInvalid(idx);
				return TR();
			}
			BucketWidthType bucket_width_type = ClassifyBucketWidthErrorThrow(bucket_width);
			switch (bucket_width_type) {
			case BucketWidthType::CONVERTIBLE_TO_MICROS:
				return OriginWidthConvertibleToMicrosTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			case BucketWidthType::CONVERTIBLE_TO_MONTHS:
				return OriginWidthConvertibleToMonthsTernaryOperator::Operation<TA, TB, TC, TR>(bucket_width, ts,
				                                                                                origin);
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}